

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>
::
merge<phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>
           *this,raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                 *src)

{
  bool bVar1;
  InsertSlot<false> *f;
  pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *in_RCX;
  iterator local_70;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>
  *local_60;
  ctrl_t *local_58;
  pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>::iterator,_bool>
  local_50;
  undefined1 local_38 [8];
  iterator e;
  iterator it;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
  *src_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
  *this_local;
  
  if ((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
       *)this != src) {
    join_0x00000010_0x00000000_ =
         raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
         ::begin(src);
    _local_38 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                ::end(src);
    while( true ) {
      bVar1 = priv::operator!=((iterator *)&e.field_1,(iterator *)local_38);
      if (!bVar1) break;
      local_58 = it.ctrl_;
      local_60 = this;
      f = (InsertSlot<false> *)
          hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,void>
          ::
          element<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>>
                    ((slot_type *)it.ctrl_);
      hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,void>
      ::
      apply<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>::InsertSlot<false>,std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>&,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>>
                (&local_50,
                 (hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,void>
                  *)&local_60,f,in_RCX);
      if ((local_50.second & 1U) != 0) {
        raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
        ::const_iterator::const_iterator((const_iterator *)&local_70,stack0xffffffffffffffd8);
        raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
        ::erase_meta_only(src,(const_iterator)local_70);
      }
      raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
      ::iterator::operator++((iterator *)&e.field_1);
    }
    return;
  }
  __assert_fail("this != &src",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x66c,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, phmap::priv::(anonymous namespace)::NonMovableKeyHash, phmap::priv::(anonymous namespace)::NonMovableKeyEq, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>>::merge(raw_hash_set<Policy, H, E, Alloc> &) [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, Hash = phmap::priv::(anonymous namespace)::NonMovableKeyHash, Eq = phmap::priv::(anonymous namespace)::NonMovableKeyEq, Alloc = std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>, H = phmap::priv::(anonymous namespace)::NonMovableKeyHash, E = phmap::priv::(anonymous namespace)::NonMovableKeyEq]"
               );
}

Assistant:

void merge(raw_hash_set<Policy, H, E, Alloc>& src) {  // NOLINT
        assert(this != &src);
        for (auto it = src.begin(), e = src.end(); it != e; ++it) {
            if (PolicyTraits::apply(InsertSlot<false>{*this, std::move(*it.slot_)},
                                    PolicyTraits::element(it.slot_))
                .second) {
                src.erase_meta_only(it);
            }
        }
    }